

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_14a672::BuildEngineImpl::~BuildEngineImpl(BuildEngineImpl *this)

{
  _Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
  *this_00;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
  *p_Var1;
  size_t __n;
  _Map_pointer __nfinish;
  _Map_pointer __nfinish_00;
  __node_ptr __n_00;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
  *this_01;
  
  (this->super_BuildDBDelegate)._vptr_BuildDBDelegate = (_func_int **)&PTR__BuildEngineImpl_001f4018
  ;
  std::mutex::lock(&this->buildEngineMutex);
  pthread_mutex_unlock((pthread_mutex_t *)&this->buildEngineMutex);
  std::
  vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
  ::~vector(&this->ruleScanRecordBlocks);
  std::
  vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
  ::~vector(&this->freeRuleScanRecords);
  std::condition_variable::~condition_variable(&this->finishedTaskInfosCondition);
  this_00 = (_Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
             *)(this->finishedTaskInfos).
               super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  __n_00 = (__node_ptr)
           ((long)(this->finishedTaskInfos).
                  super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00 >> 3);
  std::
  _Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
  ::_M_deallocate(this_00,(pointer)__n_00,__n);
  if ((this->readyTaskInfos).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
      ._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    std::
    _Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
    ::_M_destroy_nodes((_Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                        *)(this->readyTaskInfos).
                          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node,
                       (this->readyTaskInfos).
                       super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node + 1,__nfinish);
    __n_00 = (__node_ptr)
             ((this->readyTaskInfos).
              super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
              ._M_impl.super__Deque_impl_data._M_map_size << 3);
    operator_delete((this->readyTaskInfos).
                    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
                    ._M_impl.super__Deque_impl_data._M_map,(ulong)__n_00);
  }
  std::
  _Hashtable<llbuild::core::Task_*,_std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::Task_*>,_std::hash<llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->taskInfos)._M_h);
  std::
  _Hashtable<llbuild::core::Task_*,_std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::Task_*>,_std::hash<llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_deallocate_buckets(&(this->taskInfos)._M_h);
  this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
             *)(this->ruleInfos)._M_h._M_before_begin._M_nxt;
  while (this_01 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
          *)0x0) {
    p_Var1 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
               **)this_01;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>_>_>
    ::_M_deallocate_node(this_01,__n_00);
    this_01 = p_Var1;
  }
  memset((this->ruleInfos)._M_h._M_buckets,0,(this->ruleInfos)._M_h._M_bucket_count << 3);
  (this->ruleInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ruleInfos)._M_h._M_element_count = 0;
  std::
  _Hashtable<llbuild::core::KeyID,_std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::KeyID>,_std::hash<llbuild::core::KeyID>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_deallocate_buckets(&(this->ruleInfos)._M_h);
  std::
  vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
  ::~vector(&this->ruleInfosToScan);
  std::
  vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
  ::~vector(&this->finishedInputRequests);
  if ((this->inputRequests).
      super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
      ._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    std::
    _Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
    ::_M_destroy_nodes((_Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                        *)(this->inputRequests).
                          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node,
                       (this->inputRequests).
                       super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node + 1,__nfinish_00);
    operator_delete((this->inputRequests).
                    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                    ._M_impl.super__Deque_impl_data._M_map,
                    (this->inputRequests).
                    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                    ._M_impl.super__Deque_impl_data._M_map_size << 3);
  }
  llvm::
  DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
  ::~DenseMap((DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
               *)&this->cancellationDelegates);
  std::
  unique_ptr<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>_>::
  ~unique_ptr(&this->executionQueue);
  std::__cxx11::string::_M_dispose();
  std::
  unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
  ::~unique_ptr(&this->trace);
  std::unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>::~unique_ptr
            (&this->db);
  llvm::StringMap<llbuild::core::KeyID,_llvm::MallocAllocator>::~StringMap(&this->keyTable);
  llbuild::core::BuildDBDelegate::~BuildDBDelegate(&this->super_BuildDBDelegate);
  return;
}

Assistant:

~BuildEngineImpl() {
    // Make sure that there aren't any currently running builds before
    // tearing down.
    std::lock_guard<std::mutex> lock(buildEngineMutex);
  }